

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O1

void dw_empty_errlist_item(Dwarf_Error e_in)

{
  Dwarf_Error m;
  ulong uVar1;
  Dwarf_Error *ppDVar2;
  
  if (static_used != 0) {
    ppDVar2 = staticerrlist;
    uVar1 = 0;
    do {
      m = *ppDVar2;
      if (m == e_in) {
        if (m->er_static_alloc == 2) {
          if (m < (Dwarf_Error)0x11) goto LAB_0015347e;
          _dwarf_error_destructor(m);
          free(&m[-1].er_msg);
        }
        *ppDVar2 = (Dwarf_Error)0x0;
      }
LAB_0015347e:
      uVar1 = uVar1 + 1;
      ppDVar2 = ppDVar2 + 1;
    } while (uVar1 < static_used);
  }
  return;
}

Assistant:

static void
dw_empty_errlist_item(Dwarf_Error e_in)
{
    unsigned i = 0;
    if (!e_in) {
        return;
    }
    for ( ; i <static_used; ++i) {
        Dwarf_Error e = staticerrlist[i];
        if (e != e_in) {
            continue;
        }
        if (e->er_static_alloc == DE_MALLOC) {
            /* e is the returned address, not
                the base. Free by the base.  */
            void *mallocaddr = 0;

            if ( (uintptr_t)e > DW_RESERVE) {
                mallocaddr = (char*)e - DW_RESERVE;
            } else {
                /*  Impossible */
                continue;
            }
            _dwarf_error_destructor(e);
            free(mallocaddr);
        }
        staticerrlist[i] = 0;
    }
}